

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O0

void __thiscall
icu_63::ContractionsAndExpansions::forCodePoint
          (ContractionsAndExpansions *this,CollationData *d,UChar32 c,UErrorCode *ec)

{
  UBool UVar1;
  uint32_t local_2c;
  uint32_t ce32;
  UErrorCode *ec_local;
  CollationData *pCStack_18;
  UChar32 c_local;
  CollationData *d_local;
  ContractionsAndExpansions *this_local;
  
  UVar1 = ::U_FAILURE(*ec);
  if (UVar1 == '\0') {
    this->errorCode = *ec;
    local_2c = CollationData::getCE32(d,c);
    pCStack_18 = d;
    if (local_2c == 0xc0) {
      pCStack_18 = d->base;
      local_2c = CollationData::getCE32(pCStack_18,c);
    }
    this->data = pCStack_18;
    handleCE32(this,c,c,local_2c);
    *ec = this->errorCode;
  }
  return;
}

Assistant:

void
ContractionsAndExpansions::forCodePoint(const CollationData *d, UChar32 c, UErrorCode &ec) {
    if(U_FAILURE(ec)) { return; }
    errorCode = ec;  // Preserve info & warning codes.
    uint32_t ce32 = d->getCE32(c);
    if(ce32 == Collation::FALLBACK_CE32) {
        d = d->base;
        ce32 = d->getCE32(c);
    }
    data = d;
    handleCE32(c, c, ce32);
    ec = errorCode;
}